

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_setroottable(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQRESULT SVar2;
  SQObject o;
  
  SVar2 = -1;
  pSVar1 = SQVM::GetUp(v,-1);
  o._type = (pSVar1->super_SQObject)._type;
  o._4_4_ = *(undefined4 *)&(pSVar1->super_SQObject).field_0x4;
  o._unVal = (pSVar1->super_SQObject)._unVal;
  if ((o._type == OT_TABLE) || (o._type == OT_NULL)) {
    SQObjectPtr::operator=(&v->_roottable,&o);
    SQVM::Pop(v);
    SVar2 = 0;
  }
  else {
    sq_throwerror(v,"invalid type");
  }
  return SVar2;
}

Assistant:

SQRESULT sq_setroottable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o) || sq_isnull(o)) {
        v->_roottable = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type"));
}